

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.h
# Opt level: O0

TypedAttribute<Imf_2_5::DeepImageState> * __thiscall
Imf_2_5::Header::typedAttribute<Imf_2_5::TypedAttribute<Imf_2_5::DeepImageState>>
          (Header *this,char *name)

{
  Attribute *pAVar1;
  TypeExc *this_00;
  TypedAttribute<Imf_2_5::DeepImageState> *tattr;
  Attribute *attr;
  char *in_stack_00000288;
  Header *in_stack_00000290;
  TypedAttribute<Imf_2_5::DeepImageState> *local_30;
  
  pAVar1 = operator[](in_stack_00000290,in_stack_00000288);
  if (pAVar1 == (Attribute *)0x0) {
    local_30 = (TypedAttribute<Imf_2_5::DeepImageState> *)0x0;
  }
  else {
    local_30 = (TypedAttribute<Imf_2_5::DeepImageState> *)
               __dynamic_cast(pAVar1,&Attribute::typeinfo,
                              &TypedAttribute<Imf_2_5::DeepImageState>::typeinfo,0);
  }
  if (local_30 == (TypedAttribute<Imf_2_5::DeepImageState> *)0x0) {
    this_00 = (TypeExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::TypeExc::TypeExc(this_00,"Unexpected attribute type.");
    __cxa_throw(this_00,&Iex_2_5::TypeExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  return local_30;
}

Assistant:

const T &
Header::typedAttribute (const char name[]) const
{
    const Attribute *attr = &(*this)[name];
    const T *tattr = dynamic_cast <const T*> (attr);

    if (tattr == 0)
	throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return *tattr;
}